

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_stream_amend.c
# Opt level: O3

MPP_RET h264e_vepu_stream_amend_sync_ref_idc(HalH264eVepuStreamAmend *ctx)

{
  byte bVar1;
  RK_U32 offset;
  RK_U32 length;
  H264eSlice *pHVar2;
  MppPacket packet;
  int fd;
  uint uVar3;
  void *pvVar4;
  MppBuffer buffer;
  RK_U8 *buf;
  byte bVar5;
  RK_S32 len;
  RK_U32 local_2c;
  
  pHVar2 = ctx->slice;
  packet = ctx->packet;
  offset = ctx->buf_base;
  length = ctx->old_length;
  local_2c = length;
  pvVar4 = mpp_packet_get_pos(packet);
  buffer = mpp_packet_get_buffer(packet);
  fd = mpp_buffer_get_fd_with_caller(buffer,"h264e_vepu_stream_amend_sync_ref_idc");
  mpp_dmabuf_sync_partial_begin(fd,1,offset,length,"h264e_vepu_stream_amend_sync_ref_idc");
  bVar1 = *(byte *)((long)pvVar4 + (long)(int)offset + 4);
  uVar3 = pHVar2->nal_reference_idc;
  if (uVar3 != (bVar1 >> 5 & 3)) {
    buf = (RK_U8 *)((long)pvVar4 + (long)(int)offset);
    bVar5 = (byte)uVar3;
    if (pHVar2->is_multi_slice == 0) {
      buf[4] = (bVar5 & 3) << 5 | bVar1 & 0x9f;
    }
    else {
      do {
        uVar3 = get_next_nal(buf,(RK_S32 *)&local_2c);
        buf[4] = buf[4] & 0x9f | (bVar5 & 3) << 5;
        buf = buf + uVar3;
      } while (local_2c != 0);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_stream_amend_sync_ref_idc(HalH264eVepuStreamAmend *ctx)
{
    H264eSlice *slice = ctx->slice;
    MppPacket pkt = ctx->packet;
    RK_S32 base = ctx->buf_base;
    RK_S32 len = ctx->old_length;
    RK_U8 *p = mpp_packet_get_pos(pkt) + base;
    RK_U8 val = 0;
    RK_S32 hw_nal_ref_idc = 0;
    RK_S32 sw_nal_ref_idc = 0;

    {
        MppBuffer buf = mpp_packet_get_buffer(pkt);
        RK_S32 fd = mpp_buffer_get_fd(buf);

        mpp_dmabuf_sync_partial_begin(fd, 1, base, len, __FUNCTION__);
    }

    val = p[4];
    hw_nal_ref_idc = (val >> 5) & 0x3;
    sw_nal_ref_idc = slice->nal_reference_idc;

    if (hw_nal_ref_idc == sw_nal_ref_idc)
        return MPP_OK;

    /* fix nal_ref_idc in all slice */
    if (!slice->is_multi_slice) {
        /* single slice do NOT scan */
        val = val & (~0x60);
        val |= (sw_nal_ref_idc << 5) & 0x60;
        p[4] = val;
        return MPP_OK;
    }

    /* multi-slice fix each nal_ref_idc */
    do {
        RK_U32 nal_len = get_next_nal(p, &len);

        val = p[4];
        val = val & (~0x60);
        val |= (sw_nal_ref_idc << 5) & 0x60;
        p[4] = val;

        if (len == 0)
            break;

        p += nal_len;
    } while (1);

    return MPP_OK;
}